

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

shared_ptr<Scene> __thiscall
Scene::Create(Scene *this,shared_ptr<myvk::Queue> *graphics_queue,char *filename,
             atomic<const_char_*> *notification_ptr)

{
  char cVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  source_loc loc;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  size_t sVar7;
  element_type *peVar8;
  logger *plVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  Scene *this_02;
  shared_ptr<Scene> sVar11;
  string base_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  texture_filenames;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> meshes;
  undefined1 local_b8 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  VkSampler local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> local_58;
  basic_string_view<char> local_40;
  
  local_b8._24_8_ = filename;
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0xa0);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0032c928;
  this_02 = (Scene *)(this_01 + 1);
  memset(this_02,0,0x90);
  uVar2 = local_b8._24_8_;
  sVar7 = strlen((char *)local_b8._24_8_);
  local_98._M_pi = &local_88;
  if (sVar7 == 0) {
    local_90 = (VkSampler)0x0;
    local_88._vptr__Sp_counted_base._0_1_ = 0;
  }
  else {
    peVar8 = (element_type *)((long)&((Base *)uVar2)->_vptr_Base + sVar7);
    do {
      cVar1 = *(char *)((long)&peVar8[-1].m_allocator + 7);
      if ((cVar1 == '/') || (cVar1 == '\\')) break;
      bVar5 = (ulong)uVar2 < peVar8;
      peVar8 = (element_type *)((long)&peVar8[-1].m_allocator + 7);
    } while (bVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,uVar2);
  }
  local_58.super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (notification_ptr != (atomic<const_char_*> *)0x0) {
    LOCK();
    (notification_ptr->_M_b)._M_p = "Loading Mesh";
    UNLOCK();
  }
  bVar5 = load_meshes((char *)local_b8._24_8_,(char *)local_98._M_pi,&local_58,&local_78);
  if (bVar5) {
    plVar9 = spdlog::default_logger_raw();
    local_b8._0_8_ = (_func_int **)0x0;
    local_b8._8_8_ = (element_type *)0x0;
    local_b8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40.data_ = "Meshes loaded from {}";
    local_40.size_ = 0x15;
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    spdlog::logger::log_<fmt::v7::basic_string_view<char>,char_const*&>
              (plVar9,loc,info,&local_40,(char **)(local_b8 + 0x18));
    if (notification_ptr != (atomic<const_char_*> *)0x0) {
      LOCK();
      (notification_ptr->_M_b)._M_p = "Optimizing Mesh and Creating Buffers";
      UNLOCK();
    }
    load_buffers_and_draw_cmd(this_02,graphics_queue,&local_58);
    if (notification_ptr != (atomic<const_char_*> *)0x0) {
      LOCK();
      (notification_ptr->_M_b)._M_p = "Loading Textures";
      UNLOCK();
    }
    iVar6 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    myvk::Sampler::Create
              ((Sampler *)local_b8,(Ptr<Device> *)CONCAT44(extraout_var,iVar6),VK_FILTER_LINEAR,
               VK_SAMPLER_ADDRESS_MODE_REPEAT,VK_SAMPLER_MIPMAP_MODE_LINEAR,1000.0,false,1.0);
    uVar3 = local_b8._8_8_;
    uVar2 = local_b8._0_8_;
    local_b8._0_8_ = (_func_int **)0x0;
    local_b8._8_8_ = (element_type *)0x0;
    uVar4 = local_b8._8_8_;
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this_01[1]._M_use_count;
    this_01[1]._vptr__Sp_counted_base = (_func_int **)uVar2;
    local_b8._8_4_ = (undefined4)uVar3;
    local_b8._12_4_ = SUB84(uVar3,4);
    this_01[1]._M_use_count = local_b8._8_4_;
    this_01[1]._M_weak_count = local_b8._12_4_;
    local_b8._8_8_ = uVar4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((element_type *)local_b8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
    load_textures(this_02,graphics_queue,&local_78);
    process_texture_errors(this_02);
    iVar6 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    create_descriptors(this_02,(shared_ptr<myvk::Device> *)CONCAT44(extraout_var_00,iVar6));
    (this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_02;
    (this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = this_01;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    plVar9 = spdlog::default_logger_raw();
    local_b8._0_8_ = (_func_int **)0x0;
    local_b8._8_8_ = (element_type *)0x0;
    local_b8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    spdlog::logger::log(plVar9,0.0);
    (this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::vector<Scene::Mesh,_std::allocator<Scene::Mesh>_>::~vector(&local_58);
  _Var10._M_pi = extraout_RDX;
  if (local_98._M_pi != &local_88) {
    operator_delete(local_98._M_pi,
                    CONCAT71(local_88._vptr__Sp_counted_base._1_7_,
                             local_88._vptr__Sp_counted_base._0_1_) + 1);
    _Var10._M_pi = extraout_RDX_00;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    _Var10._M_pi = extraout_RDX_01;
  }
  sVar11.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var10._M_pi;
  sVar11.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Scene>)sVar11.super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Scene> Scene::Create(const std::shared_ptr<myvk::Queue> &graphics_queue, const char *filename,
                                     std::atomic<const char *> *notification_ptr) {
	std::shared_ptr<Scene> ret = std::make_shared<Scene>();

	std::string base_dir = get_base_dir(filename);

	std::vector<Mesh> meshes;
	std::vector<std::string> texture_filenames;

	if (notification_ptr)
		notification_ptr->store("Loading Mesh");
	if (!load_meshes(filename, base_dir.c_str(), &meshes, &texture_filenames)) {
		spdlog::error("Failed to load meshes");
		return nullptr;
	}
	spdlog::info("Meshes loaded from {}", filename);

	if (notification_ptr)
		notification_ptr->store("Optimizing Mesh and Creating Buffers");
	ret->load_buffers_and_draw_cmd(graphics_queue, meshes);
	if (notification_ptr)
		notification_ptr->store("Loading Textures");
	ret->m_sampler =
	    myvk::Sampler::Create(graphics_queue->GetDevicePtr(), VK_FILTER_LINEAR, VK_SAMPLER_ADDRESS_MODE_REPEAT,
	                          VK_SAMPLER_MIPMAP_MODE_LINEAR, VK_LOD_CLAMP_NONE);
	ret->load_textures(graphics_queue, texture_filenames);
	ret->process_texture_errors();
	ret->create_descriptors(graphics_queue->GetDevicePtr());

	return ret;
}